

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameUnmapSelectCb(Walker *pWalker,Select *p)

{
  Parse *pParse_00;
  Select *in_RSI;
  Walker *in_RDI;
  SrcList *pSrc;
  ExprList *pList;
  int i;
  Parse *pParse;
  SrcList *pExpr;
  Parse *in_stack_ffffffffffffffd0;
  int local_24;
  int local_4;
  
  pParse_00 = in_RDI->pParse;
  if (pParse_00->nErr == 0) {
    if ((in_RSI->selFlags & 0x4200000) == 0) {
      if (in_RSI->pEList != (ExprList *)0x0) {
        in_stack_ffffffffffffffd0 = (Parse *)in_RSI->pEList;
        for (local_24 = 0; local_24 < *(int *)&in_stack_ffffffffffffffd0->db;
            local_24 = local_24 + 1) {
          if (((&in_stack_ffffffffffffffd0->pVdbe)[(long)local_24 * 3] != (Vdbe *)0x0) &&
             ((*(ushort *)((long)&in_stack_ffffffffffffffd0->rc + (long)local_24 * 0x18 + 1) & 3) ==
              0)) {
            sqlite3RenameTokenRemap
                      (pParse_00,(void *)0x0,(&in_stack_ffffffffffffffd0->pVdbe)[(long)local_24 * 3]
                      );
          }
        }
      }
      if (in_RSI->pSrc != (SrcList *)0x0) {
        pExpr = in_RSI->pSrc;
        for (local_24 = 0; local_24 < pExpr->nSrc; local_24 = local_24 + 1) {
          sqlite3RenameTokenRemap
                    (pParse_00,(void *)0x0,
                     ((anon_union_8_2_443a03b8_for_u *)pExpr->a)[(long)local_24 * 9].zToken);
          if ((*(ushort *)((long)pExpr->a + (long)local_24 * 0x48 + 0x19) >> 0xb & 1) == 0) {
            sqlite3WalkExpr((Walker *)in_stack_ffffffffffffffd0,(Expr *)pExpr);
          }
          else {
            unmapColumnIdlistNames(in_stack_ffffffffffffffd0,(IdList *)pExpr);
          }
        }
      }
      renameWalkWith(in_RDI,in_RSI);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int renameUnmapSelectCb(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i;
  if( pParse->nErr ) return WRC_Abort;
  testcase( p->selFlags & SF_View );
  testcase( p->selFlags & SF_CopyCte );
  if( p->selFlags & (SF_View|SF_CopyCte) ){
    return WRC_Prune;
  }
  if( ALWAYS(p->pEList) ){
    ExprList *pList = p->pEList;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].zEName && pList->a[i].fg.eEName==ENAME_NAME ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pList->a[i].zEName);
      }
    }
  }
  if( ALWAYS(p->pSrc) ){  /* Every Select as a SrcList, even if it is empty */
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      sqlite3RenameTokenRemap(pParse, 0, (void*)pSrc->a[i].zName);
      if( pSrc->a[i].fg.isUsing==0 ){
        sqlite3WalkExpr(pWalker, pSrc->a[i].u3.pOn);
      }else{
        unmapColumnIdlistNames(pParse, pSrc->a[i].u3.pUsing);
      }
    }
  }

  renameWalkWith(pWalker, p);
  return WRC_Continue;
}